

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O3

void __thiscall CppGenerator::computeParallelizeGroup(CppGenerator *this,bool paralleize_groups)

{
  TreeDecomposition *this_00;
  uint uVar1;
  bool *__s;
  size_t *__s_00;
  View *pVVar2;
  TDNode *pTVar3;
  ulong uVar4;
  pointer pvVar5;
  size_t gid;
  long lVar6;
  long lVar7;
  ulong uVar8;
  
  pvVar5 = (this->viewGroups).
           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar6 = (long)(this->viewGroups).
                super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar5;
  lVar7 = lVar6 >> 3;
  uVar8 = lVar7 * -0x5555555555555555;
  __s = (bool *)operator_new__(uVar8);
  memset(__s,0,uVar8);
  this->_parallelizeGroup = __s;
  uVar8 = -(ulong)(uVar8 >> 0x3d != 0) | lVar7 * 0x5555555555555558;
  __s_00 = (size_t *)operator_new__(uVar8);
  memset(__s_00,0,uVar8);
  this->_threadsPerGroup = __s_00;
  if (lVar6 != 0 && paralleize_groups) {
    lVar6 = 0;
    uVar8 = 0;
    do {
      this_00 = (this->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      pVVar2 = QueryCompiler::getView
                         ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr,**(size_t **)
                                   ((long)&(pvVar5->
                                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                           )._M_impl.super__Vector_impl_data + lVar6));
      pTVar3 = TreeDecomposition::getRelation(this_00,(ulong)pVVar2->_origin);
      if (1 < pTVar3->_threads) {
        this->_parallelizeGroup[uVar8] = true;
        uVar1 = std::thread::hardware_concurrency();
        uVar4 = (ulong)uVar1;
        if (pTVar3->_threads < (ulong)uVar1) {
          uVar4 = pTVar3->_threads;
        }
        this->_threadsPerGroup[uVar8] = uVar4;
      }
      uVar8 = uVar8 + 1;
      pvVar5 = (this->viewGroups).
               super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar6 = lVar6 + 0x18;
    } while (uVar8 < (ulong)(((long)(this->viewGroups).
                                    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar5 >> 3)
                            * -0x5555555555555555));
  }
  return;
}

Assistant:

void CppGenerator::computeParallelizeGroup(bool paralleize_groups)
{
    _parallelizeGroup = new bool[viewGroups.size()]();
    _threadsPerGroup = new size_t[viewGroups.size()]();

    if (!paralleize_groups)
        return;
    
    for (size_t gid = 0; gid < viewGroups.size(); ++gid)
    {
        TDNode* node = _td->getRelation(_qc->getView(viewGroups[gid][0])->_origin);

        if (node->_threads > 1)
        {
            _parallelizeGroup[gid] = true;            
            _threadsPerGroup[gid] =
                std::min(node->_threads, (size_t)std::thread::hardware_concurrency());
        }        
    }
}